

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt.c
# Opt level: O1

LispPTR N_OP_blt(LispPTR destptr,LispPTR sourceptr,LispPTR wordcount)

{
  DLword *pDVar1;
  ulong uVar2;
  
  pDVar1 = Lisp_world;
  if ((wordcount & 0xfff0000) == 0xe0000) {
    if ((wordcount & 0xffff) != 0) {
      uVar2 = (ulong)((wordcount & 0xffff) * 2);
      do {
        *(undefined2 *)((long)pDVar1 + uVar2 + (ulong)destptr * 2 + -2 ^ 2) =
             *(undefined2 *)((long)pDVar1 + uVar2 + (ulong)sourceptr * 2 + -2 ^ 2);
        uVar2 = uVar2 - 2;
      } while ((int)uVar2 != 0);
    }
    return wordcount;
  }
  MachineState.tosvalue = wordcount;
  MachineState.errorexit = 1;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_blt(LispPTR destptr, LispPTR sourceptr, LispPTR wordcount) {
  DLword *source68k;
  DLword *dest68k;
  int nw;

  if ((wordcount & SEGMASK) != S_POSITIVE) ERROR_EXIT(wordcount);
  nw = wordcount & 0xffff;

  source68k = NativeAligned2FromLAddr(sourceptr) + nw;
  dest68k = NativeAligned2FromLAddr(destptr) + nw;

  while (nw) {
    (GETWORD(--dest68k)) = GETWORD(--source68k);
    nw--;
  }

  return (wordcount);
}